

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O3

Bool GetParsePickListValue(TidyDocImpl *doc,TidyOptionImpl *entry,uint *result)

{
  StreamIn *in;
  PickListItems *paPVar1;
  uint c;
  Bool BVar2;
  int iVar3;
  ulong uVar4;
  ctmbstr s2;
  PickListItems *paPVar5;
  ulong uVar6;
  bool bVar7;
  tmbchar work [16];
  tmbchar local_48 [24];
  
  c = SkipWhite(&doc->config);
  local_48[0] = '\0';
  local_48[1] = '\0';
  local_48[2] = '\0';
  local_48[3] = '\0';
  local_48[4] = '\0';
  local_48[5] = '\0';
  local_48[6] = '\0';
  local_48[7] = '\0';
  local_48[8] = '\0';
  local_48[9] = '\0';
  local_48[10] = '\0';
  local_48[0xb] = '\0';
  local_48[0xc] = '\0';
  local_48[0xd] = '\0';
  local_48[0xe] = '\0';
  local_48[0xf] = '\0';
  if (c != 0xffffffff) {
    uVar4 = 0;
    while( true ) {
      BVar2 = prvTidyIsWhite(c);
      if ((((BVar2 != no) || (c == 10)) || (c == 0xd)) ||
         (local_48[uVar4] = (tmbchar)c, (doc->config).c == 0xffffffff)) goto LAB_00155e0b;
      in = (doc->config).cfgIn;
      if (in == (StreamIn *)0x0) break;
      c = prvTidyReadChar(in);
      (doc->config).c = c;
      if ((c == 0xffffffff) || (bVar7 = 0xe < uVar4, uVar4 = uVar4 + 1, bVar7)) goto LAB_00155e0b;
    }
    (doc->config).c = 0xffffffff;
  }
LAB_00155e0b:
  paPVar1 = entry->pickList;
  if ((paPVar1 != (PickListItems *)0x0) && ((*paPVar1)[0].label != (ctmbstr)0x0)) {
    uVar4 = 0;
    paPVar5 = paPVar1;
    do {
      s2 = *(ctmbstr *)((long)*paPVar5 + 0x10);
      if (s2 != (ctmbstr)0x0) {
        uVar6 = 1;
        do {
          iVar3 = prvTidytmbstrcasecmp(local_48,s2);
          if (iVar3 == 0) {
            *result = (uint)uVar4;
            return yes;
          }
          s2 = *(ctmbstr *)((long)*paPVar5 + uVar6 * 8 + 0x10);
          uVar6 = (ulong)((int)uVar6 + 1);
        } while (s2 != (ctmbstr)0x0);
      }
      uVar4 = (ulong)((uint)uVar4 + 1);
      paPVar5 = (PickListItems *)((long)*paPVar1 + uVar4 * 0x60);
    } while (*(long *)((long)*paPVar1 + uVar4 * 0x60) != 0);
  }
  prvTidyReportBadArgument(doc,entry->name);
  return no;
}

Assistant:

static Bool GetParsePickListValue( TidyDocImpl* doc, const TidyOptionImpl* entry, uint *result )
{
    TidyConfigImpl* cfg = &doc->config;
    tchar c = SkipWhite( cfg );
    tmbchar work[ 16 ] = {0};
    tmbstr cp = work, end = work + sizeof(work);

    while ( c!=EndOfStream && cp < end && !TY_(IsWhite)(c) && c != '\r' && c != '\n' )
    {
        *cp++ = (tmbchar) c;
        c = AdvanceChar( cfg );
    }

    if ( GetPickListValue( work, entry->pickList, result ) != yes )
    {
        TY_(ReportBadArgument)( doc, entry->name );
        return no;
    }

    return yes;
}